

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsoncpp.cpp
# Opt level: O2

void __thiscall Json::Value::swap(Value *this,Value *other)

{
  anon_struct_4_2_14fb5ae2_for_bits_ aVar1;
  ValueHolder VVar2;
  ptrdiff_t pVar3;
  
  aVar1 = this->bits_;
  this->bits_ = other->bits_;
  other->bits_ = aVar1;
  VVar2 = this->value_;
  this->value_ = other->value_;
  other->value_ = VVar2;
  std::swap<Json::Value::Comments>(&this->comments_,&other->comments_);
  pVar3 = this->start_;
  this->start_ = other->start_;
  other->start_ = pVar3;
  pVar3 = this->limit_;
  this->limit_ = other->limit_;
  other->limit_ = pVar3;
  return;
}

Assistant:

void Value::swap(Value& other) {
  swapPayload(other);
  std::swap(comments_, other.comments_);
  std::swap(start_, other.start_);
  std::swap(limit_, other.limit_);
}